

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemorySize
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemorySize *curr)

{
  char **__return_storage_ptr___00;
  Name memory;
  Address x;
  long lVar1;
  Name NVar2;
  undefined1 local_50 [8];
  MemoryInstanceInfo info;
  
  getMemoryInstanceInfo((MemoryInstanceInfo *)local_50,this,(Name)*(string_view *)(curr + 0x10));
  memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
  memory.super_IString.str._M_len = (size_t)info.instance;
  x = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_50,memory);
  NVar2.super_IString.str._M_str = (char *)info.instance;
  NVar2.super_IString.str._M_len = (size_t)*(Module **)((long)local_50 + 0x20);
  lVar1 = wasm::Module::getMemory(NVar2);
  __return_storage_ptr___00 = &info.name.super_IString.str._M_str;
  Literal::makeFromInt64
            ((Literal *)__return_storage_ptr___00,x.addr,(Type)*(uintptr_t *)(lVar1 + 0x50));
  Flow::Flow(__return_storage_ptr__,(Literal *)__return_storage_ptr___00);
  wasm::Literal::~Literal((Literal *)&info.name.super_IString.str._M_str);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemorySize(MemorySize* curr) {
    NOTE_ENTER("MemorySize");
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    return Literal::makeFromInt64(memorySize, memory->addressType);
  }